

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int prune_ref_mv_idx_search
              (int ref_mv_idx,int best_ref_mv_idx,int_mv (*save_mv) [2],MB_MODE_INFO *mbmi,
              int pruning_factor)

{
  int iVar1;
  int iVar2;
  int iVar3;
  MB_MODE_INFO *in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  char in_R8B;
  int mv_diff;
  int idx;
  int thr;
  int is_comp_pred;
  int i;
  int local_38;
  int local_34;
  int local_28;
  
  iVar1 = has_second_ref(in_RCX);
  if (0 < in_EDI) {
    for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
      if (*(int *)(in_RDX + (long)local_34 * 8) != -0x7fff8000) {
        local_38 = 0;
        for (local_28 = 0; local_28 < iVar1 + 1; local_28 = local_28 + 1) {
          iVar2 = (int)*(short *)(in_RDX + (long)local_34 * 8 + (long)local_28 * 4) -
                  (int)in_RCX->mv[local_28].as_mv.row;
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          iVar3 = (int)*(short *)(in_RDX + (long)local_34 * 8 + 2 + (long)local_28 * 4) -
                  (int)*(short *)((long)in_RCX->mv + (long)local_28 * 4 + 2);
          if (iVar3 < 1) {
            iVar3 = -iVar3;
          }
          local_38 = iVar2 + iVar3 + local_38;
        }
        if ((in_ESI == -1) && (local_38 <= iVar1 + 1 << (in_R8B + 1U & 0x1f))) {
          return 1;
        }
      }
    }
  }
  if (in_EDI < 2) {
    for (local_28 = 0; local_28 < iVar1 + 1; local_28 = local_28 + 1) {
      *(int_mv *)(in_RDX + (long)in_EDI * 8 + (long)local_28 * 4) = in_RCX->mv[local_28];
    }
  }
  return 0;
}

Assistant:

static int prune_ref_mv_idx_search(int ref_mv_idx, int best_ref_mv_idx,
                                   int_mv save_mv[MAX_REF_MV_SEARCH - 1][2],
                                   MB_MODE_INFO *mbmi, int pruning_factor) {
  int i;
  const int is_comp_pred = has_second_ref(mbmi);
  const int thr = (1 + is_comp_pred) << (pruning_factor + 1);

  // Skip the evaluation if an MV match is found.
  if (ref_mv_idx > 0) {
    for (int idx = 0; idx < ref_mv_idx; ++idx) {
      if (save_mv[idx][0].as_int == INVALID_MV) continue;

      int mv_diff = 0;
      for (i = 0; i < 1 + is_comp_pred; ++i) {
        mv_diff += abs(save_mv[idx][i].as_mv.row - mbmi->mv[i].as_mv.row) +
                   abs(save_mv[idx][i].as_mv.col - mbmi->mv[i].as_mv.col);
      }

      // If this mode is not the best one, and current MV is similar to
      // previous stored MV, terminate this ref_mv_idx evaluation.
      if (best_ref_mv_idx == -1 && mv_diff <= thr) return 1;
    }
  }

  if (ref_mv_idx < MAX_REF_MV_SEARCH - 1) {
    for (i = 0; i < is_comp_pred + 1; ++i)
      save_mv[ref_mv_idx][i].as_int = mbmi->mv[i].as_int;
  }

  return 0;
}